

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> * __thiscall
Catch::Generators::
makeGenerators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
          (Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
           *__return_storage_ptr__,Generators *this,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *val,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_1,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_2,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_3)

{
  IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
  local_38;
  
  local_38._M_head_impl = in_RAX;
  value<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
            ((Generators *)&local_38,
             (pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *)this);
  Generators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>::
  Generators<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
            ((Generators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>> *)
             __return_storage_ptr__,
             (GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *)
             &local_38,val,moreGenerators,moreGenerators_1,moreGenerators_2);
  if (local_38._M_head_impl !=
      (IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *)0x0) {
    (*((local_38._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }